

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O2

void __thiscall
amrex::MFPCInterp::interp
          (MFPCInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,IntVect *ng
          ,Geometry *param_7,Geometry *param_8,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  Box result;
  MFIter mfi;
  Box local_1e8;
  FabArray<amrex::FArrayBox> *local_1c8;
  FabArray<amrex::FArrayBox> *local_1c0;
  long local_1b8;
  long local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  long local_198;
  long local_190;
  ulong local_188;
  long local_178;
  double *local_170;
  long local_160;
  Box local_158;
  Array4<const_double> local_130;
  Array4<double> local_f0;
  Box local_ac;
  MFIter local_90;
  
  local_1c8 = &crsemf->super_FabArray<amrex::FArrayBox>;
  local_1c0 = &finemf->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)finemf,'\0');
  local_1b0 = (long)ccomp;
  local_1b8 = (long)fcomp;
  if (nc < 1) {
    nc = 0;
  }
  local_1a8 = (ulong)(uint)nc;
  while (local_90.currentIndex < local_90.endIndex) {
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_1c0,&local_90);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_130,local_1c8,&local_90);
    MFIter::validbox(&local_ac,&local_90);
    local_158.bigend.vect[1] = local_ac.bigend.vect[1];
    local_158.bigend.vect[2] = local_ac.bigend.vect[2];
    local_158.btype.itype = local_ac.btype.itype;
    local_158.smallend.vect[0] = local_ac.smallend.vect[0];
    local_158.smallend.vect[1] = local_ac.smallend.vect[1];
    local_158.smallend.vect[2] = local_ac.smallend.vect[2];
    local_158.bigend.vect[0] = local_ac.bigend.vect[0];
    Box::grow(&local_158,ng);
    local_1e8.smallend.vect[0] = local_158.smallend.vect[0];
    local_1e8.smallend.vect[1] = local_158.smallend.vect[1];
    local_1e8.smallend.vect[2] = local_158.smallend.vect[2];
    local_1e8.bigend.vect[0] = local_158.bigend.vect[0];
    local_1e8.bigend.vect[1] = local_158.bigend.vect[1];
    local_1e8.bigend.vect[2] = local_158.bigend.vect[2];
    local_1e8.btype.itype = local_158.btype.itype;
    Box::operator&=(&local_1e8,dest_domain);
    local_1a0 = (ulong)local_1e8.smallend.vect[1];
    uVar7 = 0;
    while (uVar6 = uVar7, uVar6 != local_1a8) {
      iVar1 = ratio->vect[2];
      local_190 = local_1b0 + uVar6;
      local_198 = local_1b8 + uVar6;
      for (uVar8 = local_1e8.smallend.vect[2]; (int)uVar8 <= local_1e8.bigend.vect[2];
          uVar8 = uVar8 + 1) {
        uVar4 = uVar8;
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar8 < 0) {
              uVar4 = (int)uVar8 >> 2;
            }
            else {
              uVar4 = uVar8 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar8 < 0) {
              uVar4 = (int)uVar8 >> 1;
            }
            else {
              uVar4 = uVar8 >> 1;
            }
          }
          else if ((int)uVar8 < 0) {
            uVar4 = ~((int)~uVar8 / iVar1);
          }
          else {
            uVar4 = (int)uVar8 / iVar1;
          }
        }
        iVar2 = ratio->vect[0];
        iVar3 = ratio->vect[1];
        local_160 = (long)local_130.begin.y;
        local_170 = local_130.p +
                    ((long)(int)uVar4 - (long)local_130.begin.z) * local_130.kstride +
                    local_130.nstride * local_190;
        local_178 = (long)local_f0.begin.y;
        for (uVar7 = local_1a0; (long)uVar7 <= (long)local_1e8.bigend.vect[1]; uVar7 = uVar7 + 1) {
          uVar4 = (uint)uVar7;
          if (iVar3 != 1) {
            if (iVar3 == 4) {
              if ((long)uVar7 < 0) {
                uVar4 = (int)uVar4 >> 2;
              }
              else {
                uVar4 = uVar4 >> 2;
              }
            }
            else if (iVar3 == 2) {
              if ((long)uVar7 < 0) {
                uVar4 = (int)uVar4 >> 1;
              }
              else {
                uVar4 = (uint)(uVar7 >> 1) & 0x7fffffff;
              }
            }
            else if ((long)uVar7 < 0) {
              uVar4 = ~((int)~uVar4 / iVar3);
            }
            else {
              uVar4 = (uint)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar7 & 0xffffffff)
                            / (long)iVar3);
            }
          }
          if (local_1e8.smallend.vect[0] <= local_1e8.bigend.vect[0]) {
            uVar9 = (long)local_1e8.smallend.vect[0];
            do {
              uVar5 = (uint)uVar9;
              if (iVar2 != 1) {
                if (iVar2 == 4) {
                  if ((long)uVar9 < 0) {
                    uVar5 = (int)uVar5 >> 2;
                  }
                  else {
                    uVar5 = uVar5 >> 2;
                  }
                }
                else if (iVar2 == 2) {
                  if ((long)uVar9 < 0) {
                    uVar5 = (int)uVar5 >> 1;
                  }
                  else {
                    uVar5 = (uint)(uVar9 >> 1) & 0x7fffffff;
                  }
                }
                else if ((long)uVar9 < 0) {
                  uVar5 = ~((int)~uVar5 / iVar2);
                }
                else {
                  uVar5 = (uint)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                       uVar9 & 0xffffffff) / (long)iVar2);
                }
              }
              local_f0.p
              [((long)(int)uVar8 - (long)local_f0.begin.z) * local_f0.kstride +
               local_f0.nstride * local_198 +
               (uVar7 - local_178) * local_f0.jstride + (uVar9 - (long)local_f0.begin.x)] =
                   local_170[((int)uVar4 - local_160) * local_130.jstride +
                             ((long)(int)uVar5 - (long)local_130.begin.x)];
              uVar9 = uVar9 + 1;
            } while ((int)uVar9 != local_1e8.bigend.vect[0] + 1);
          }
        }
      }
      local_188 = uVar6;
      uVar7 = uVar6 + 1;
    }
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MFPCInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                    IntVect const& ng, Geometry const&, Geometry const&,
                    Box const& dest_domain, IntVect const& ratio,
                    Vector<BCRec> const&, int)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                AMREX_D_TERM(int ic = amrex::coarsen(i,ratio[0]);,
                             int jc = amrex::coarsen(j,ratio[1]);,
                             int kc = amrex::coarsen(k,ratio[2]);)
                AMREX_D_PICK(fine[box_no](i,0,0,n+fcomp) = crse[box_no](ic, 0, 0,n+ccomp);,
                             fine[box_no](i,j,0,n+fcomp) = crse[box_no](ic,jc, 0,n+ccomp);,
                             fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);)
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            pcinterp_interp(fbox, fine, fcomp, nc, crse, ccomp, ratio);
        }
    }
}